

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O1

Scope __thiscall
anon_unknown.dwarf_12b4667::TGlslangToSpvTraverser::TranslateMemoryScope
          (TGlslangToSpvTraverser *this,CoherentFlags *coherentFlags)

{
  CoherentFlags CVar1;
  Scope SVar2;
  Capability local_c;
  
  CVar1 = *coherentFlags;
  if (((uint)CVar1 & 0x81) == 0) {
    SVar2 = Device;
    if ((((((uint)CVar1 & 2) == 0) && (SVar2 = QueueFamily, ((uint)CVar1 & 4) == 0)) &&
        (SVar2 = ScopeWorkgroup, ((uint)CVar1 & 8) == 0)) &&
       ((SVar2 = ScopeSubgroup, ((uint)CVar1 & 0x10) == 0 &&
        (SVar2 = ScopeShaderCallKHR, ((uint)CVar1 & 0x20) == 0)))) {
      SVar2 = Max;
    }
  }
  else {
    SVar2 = (uint)this->glslangIntermediate->useVulkanMemoryModel * 4 + Device;
  }
  if ((SVar2 == Device) && (this->glslangIntermediate->useVulkanMemoryModel != false)) {
    local_c = CapabilityVulkanMemoryModelDeviceScope;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,&local_c);
  }
  return SVar2;
}

Assistant:

spv::Scope TGlslangToSpvTraverser::TranslateMemoryScope(
    const spv::Builder::AccessChain::CoherentFlags &coherentFlags)
{
    spv::Scope scope = spv::ScopeMax;

    if (coherentFlags.volatil || coherentFlags.coherent) {
        // coherent defaults to Device scope in the old model, QueueFamilyKHR scope in the new model
        scope = glslangIntermediate->usingVulkanMemoryModel() ? spv::ScopeQueueFamilyKHR : spv::ScopeDevice;
    } else if (coherentFlags.devicecoherent) {
        scope = spv::ScopeDevice;
    } else if (coherentFlags.queuefamilycoherent) {
        scope = spv::ScopeQueueFamilyKHR;
    } else if (coherentFlags.workgroupcoherent) {
        scope = spv::ScopeWorkgroup;
    } else if (coherentFlags.subgroupcoherent) {
        scope = spv::ScopeSubgroup;
    } else if (coherentFlags.shadercallcoherent) {
        scope = spv::ScopeShaderCallKHR;
    }
    if (glslangIntermediate->usingVulkanMemoryModel() && scope == spv::ScopeDevice) {
        builder.addCapability(spv::CapabilityVulkanMemoryModelDeviceScopeKHR);
    }

    return scope;
}